

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_SupportSize(DdManager *dd,DdNode *f)

{
  int *support;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar2 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar2 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    iVar3 = -1;
  }
  else {
    if (0 < (int)uVar2) {
      memset(support,0,(ulong)uVar2 * 4);
    }
    ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
    if ((int)uVar2 < 1) {
      iVar3 = 0;
    }
    else {
      uVar1 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)(support[uVar1] == 1);
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    free(support);
  }
  return iVar3;
}

Assistant:

int
Cudd_SupportSize(
  DdManager * dd /* manager */,
  DdNode * f /* DD whose support size is sought */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep(Cudd_Regular(f),support);
    ddClearFlag(Cudd_Regular(f));

    /* Count support variables. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}